

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.hpp
# Opt level: O2

TableBinding * __thiscall duckdb::Binding::Cast<duckdb::TableBinding>(Binding *this)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if (this->binding_type == TABLE) {
    return (TableBinding *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Failed to cast binding to type - binding type mismatch",&local_39)
  ;
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET &Cast() {
		if (binding_type != TARGET::TYPE) {
			throw InternalException("Failed to cast binding to type - binding type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}